

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O1

int __thiscall Fl_Slider::handle(Fl_Slider *this,int event,int X,int Y,int W,int H)

{
  double *pdVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint unaff_R12D;
  int iVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  Fl_Widget_Tracker wp;
  Fl_Widget_Tracker local_48;
  int local_3c;
  double local_38;
  
  switch(event) {
  case 1:
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_48,(Fl_Widget *)this);
    local_38 = (double)CONCAT44(local_38._4_4_,W);
    iVar7 = Fl::event_inside(X,Y,W,H);
    if (iVar7 == 0) {
      local_3c = 0;
    }
    else {
      (this->super_Fl_Valuator).previous_value_ = (this->super_Fl_Valuator).value_;
      local_3c = CONCAT31((int3)((uint)iVar7 >> 8),local_48.wp_ != (Fl_Widget *)0x0);
    }
    bVar4 = iVar7 != 0;
    unaff_R12D = (uint)bVar4;
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_48);
    W = local_38._0_4_;
    if ((char)local_3c == '\0') {
      return (uint)bVar4;
    }
    goto LAB_001ca67e;
  case 2:
    Fl_Valuator::handle_release(&this->super_Fl_Valuator);
    return 1;
  case 3:
  case 4:
    goto switchD_001ca555_caseD_3;
  case 5:
LAB_001ca67e:
    dVar10 = (this->super_Fl_Valuator).min;
    dVar11 = (this->super_Fl_Valuator).max;
    if ((dVar10 != dVar11) || (NAN(dVar10) || NAN(dVar11))) {
      dVar11 = ((this->super_Fl_Valuator).value_ - dVar10) / (dVar11 - dVar10);
      dVar10 = 1.0;
      if ((dVar11 <= 1.0) && (dVar10 = dVar11, dVar11 < 0.0)) {
        dVar10 = 0.0;
      }
    }
    else {
      dVar10 = 0.5;
    }
    bVar2 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
    iVar7 = Fl::e_y - Y;
    iVar8 = H;
    if ((bVar2 & 1) != 0) {
      iVar7 = Fl::e_x - X;
      iVar8 = W;
    }
    if ((bVar2 & 0xfe) == 2) {
      local_3c = 0;
      if (event == 1) {
        iVar6 = iVar7 - (int)(dVar10 * (double)iVar8 + 0.5);
        local_3c = 0;
        handle::offcenter = local_3c;
        if (0xffffffea < iVar6 - 0xbU) {
          handle::offcenter = iVar6;
          return 1;
        }
      }
    }
    else {
      local_3c = (int)((float)iVar8 * *(float *)&(this->super_Fl_Valuator).field_0xa4 + 0.5);
      if (iVar8 <= local_3c) goto switchD_001ca555_default;
      if ((bVar2 & 1) == 0) {
        H = W;
      }
      iVar6 = H / 2 + (uint)((bVar2 & 0xfe) == 4) * 4 + 1;
      if (local_3c < iVar6) {
        local_3c = iVar6;
      }
      bVar4 = true;
      if (event == 1) {
        iVar6 = iVar7 - (int)(dVar10 * (double)(iVar8 - local_3c) + 0.5);
        if (iVar6 < 0) {
          handle::offcenter = 0;
        }
        else {
          handle::offcenter = local_3c;
          if (iVar6 <= local_3c) {
            unaff_R12D = 1;
            bVar4 = false;
            handle::offcenter = iVar6;
          }
        }
      }
      if (!bVar4) {
        return unaff_R12D;
      }
    }
    iVar9 = iVar7 - handle::offcenter;
    iVar8 = iVar8 - local_3c;
    local_38 = (double)iVar8;
    iVar6 = iVar7 - iVar8;
    if (local_3c <= iVar7 - iVar8) {
      iVar6 = local_3c;
    }
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    local_3c = local_3c / 2;
    do {
      iVar3 = 0;
      iVar5 = iVar7;
      if ((iVar9 < 0) || (iVar3 = iVar8, iVar5 = iVar6, iVar8 < iVar9)) {
        iVar9 = iVar3;
        handle::offcenter = iVar5;
      }
      dVar10 = (this->super_Fl_Valuator).min;
      dVar10 = Fl_Valuator::round(&this->super_Fl_Valuator,
                                  (((this->super_Fl_Valuator).max - dVar10) * (double)iVar9) /
                                  local_38 + dVar10);
      bVar4 = true;
      if (event == 1) {
        pdVar1 = &(this->super_Fl_Valuator).value_;
        if ((dVar10 != *pdVar1) || (NAN(dVar10) || NAN(*pdVar1))) {
          event = 1;
        }
        else {
          handle::offcenter = local_3c;
          event = 5;
          bVar4 = false;
        }
      }
    } while (!bVar4);
    dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
    Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
switchD_001ca555_caseD_3:
    iVar7 = 1;
    break;
  case 6:
  case 7:
    bVar4 = Fl::option(OPTION_VISIBLE_FOCUS);
    if (bVar4) {
      Fl_Widget::redraw((Fl_Widget *)this);
      return 1;
    }
  default:
switchD_001ca555_default:
    iVar7 = 0;
    break;
  case 8:
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_48,(Fl_Widget *)this);
    iVar7 = 0;
    switch(Fl::e_keysym) {
    case 0xff51:
      iVar7 = 0;
      if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 1) == 0) goto switchD_001ca5b4_default;
      dVar10 = (this->super_Fl_Valuator).value_;
      (this->super_Fl_Valuator).previous_value_ = dVar10;
      iVar7 = 1;
      if (local_48.wp_ == (Fl_Widget *)0x0) goto switchD_001ca5b4_default;
      dVar10 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar10,-1);
      dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
      Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
      break;
    case 0xff52:
      iVar7 = 0;
      if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 1) != 0) goto switchD_001ca5b4_default;
      dVar10 = (this->super_Fl_Valuator).value_;
      (this->super_Fl_Valuator).previous_value_ = dVar10;
      iVar7 = 1;
      if (local_48.wp_ == (Fl_Widget *)0x0) goto switchD_001ca5b4_default;
      dVar10 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar10,-1);
      dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
      Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
      break;
    case 0xff53:
      if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 1) == 0) goto switchD_001ca5b4_default;
      dVar10 = (this->super_Fl_Valuator).value_;
      (this->super_Fl_Valuator).previous_value_ = dVar10;
      if (local_48.wp_ == (Fl_Widget *)0x0) {
LAB_001ca86f:
        iVar7 = 1;
        goto switchD_001ca5b4_default;
      }
      dVar10 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar10,1);
      dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
      Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
LAB_001ca868:
      if (local_48.wp_ == (Fl_Widget *)0x0) goto LAB_001ca86f;
      goto LAB_001ca8bb;
    case 0xff54:
      if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 1) != 0) goto switchD_001ca5b4_default;
      dVar10 = (this->super_Fl_Valuator).value_;
      (this->super_Fl_Valuator).previous_value_ = dVar10;
      if (local_48.wp_ != (Fl_Widget *)0x0) {
        dVar10 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar10,1);
        dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
        Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
        goto LAB_001ca868;
      }
      goto LAB_001ca86f;
    default:
      goto switchD_001ca5b4_default;
    }
    iVar7 = 1;
    if (local_48.wp_ != (Fl_Widget *)0x0) {
LAB_001ca8bb:
      Fl_Valuator::handle_release(&this->super_Fl_Valuator);
      iVar7 = 1;
    }
switchD_001ca5b4_default:
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_48);
    return iVar7;
  }
  return iVar7;
}

Assistant:

int Fl_Slider::handle(int event, int X, int Y, int W, int H) {
  // Fl_Widget_Tracker wp(this);
  switch (event) {
  case FL_PUSH: {
    Fl_Widget_Tracker wp(this);
    if (!Fl::event_inside(X, Y, W, H)) return 0;
    handle_push();
    if (wp.deleted()) return 1; }
    // fall through ...
  case FL_DRAG: {

    double val;
    if (minimum() == maximum())
      val = 0.5;
    else {
      val = (value()-minimum())/(maximum()-minimum());
      if (val > 1.0) val = 1.0;
      else if (val < 0.0) val = 0.0;
    }

    int ww = (horizontal() ? W : H);
    int mx = (horizontal() ? Fl::event_x()-X : Fl::event_y()-Y);
    int S;
    static int offcenter;

    if (type() == FL_HOR_FILL_SLIDER || type() == FL_VERT_FILL_SLIDER) {

      S = 0;
      if (event == FL_PUSH) {
	int xx = int(val*ww+.5);
	offcenter = mx-xx;
	if (offcenter < -10 || offcenter > 10) offcenter = 0;
	else return 1;
      }

    } else {

      S = int(slider_size_*ww+.5); if (S >= ww) return 0;
      int T = (horizontal() ? H : W)/2+1;
      if (type()==FL_VERT_NICE_SLIDER || type()==FL_HOR_NICE_SLIDER) T += 4;
      if (S < T) S = T;
      if (event == FL_PUSH) {
	int xx = int(val*(ww-S)+.5);
	offcenter = mx-xx;
	if (offcenter < 0) offcenter = 0;
	else if (offcenter > S) offcenter = S;
	else return 1;
      }
    }

    int xx = mx-offcenter;
    double v = 0;
    char tryAgain = 1;
    while (tryAgain)
    {
      tryAgain = 0;
      if (xx < 0) {
        xx = 0;
        offcenter = mx; if (offcenter < 0) offcenter = 0;
      } else if (xx > (ww-S)) {
        xx = ww-S;
        offcenter = mx-xx; if (offcenter > S) offcenter = S;
      }
      v = round(xx*(maximum()-minimum())/(ww-S) + minimum());
      // make sure a click outside the sliderbar moves it:
      if (event == FL_PUSH && v == value()) {
        offcenter = S/2;
        event = FL_DRAG;
        tryAgain = 1;
      }
    }
    handle_drag(clamp(v));
    } return 1;
  case FL_RELEASE:
    handle_release();
    return 1;
  case FL_KEYBOARD:
    { Fl_Widget_Tracker wp(this);
      switch (Fl::event_key()) {
	case FL_Up:
	  if (horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),-1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	case FL_Down:
	  if (horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	case FL_Left:
	  if (!horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),-1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	case FL_Right:
	  if (!horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	default:
	  return 0;
      }
    }
    // break not required because of switch...
  case FL_FOCUS :
  case FL_UNFOCUS :
    if (Fl::visible_focus()) {
      redraw();
      return 1;
    } else return 0;
  case FL_ENTER :
  case FL_LEAVE :
    return 1;
  default:
    return 0;
  }
}